

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_which_secret.cpp
# Opt level: O2

void duckdb::DuckDBWhichSecretFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  CatalogTransaction transaction_00;
  GlobalTableFunctionState *pGVar1;
  FunctionData *pFVar2;
  SecretManager *path_00;
  const_reference pvVar3;
  type pSVar4;
  pointer pBVar5;
  SecretMatch secret_match;
  Value local_130;
  string local_f0;
  string local_d0;
  string local_b0;
  string type;
  string path;
  CatalogTransaction transaction;
  
  pGVar1 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  if (*(char *)&pGVar1[1]._vptr_GlobalTableFunctionState == '\0') {
    pFVar2 = optional_ptr<const_duckdb::FunctionData,_true>::operator->(&data_p->bind_data);
    path_00 = SecretManager::Get(context);
    CatalogTransaction::GetSystemCatalogTransaction(&transaction,context);
    pvVar3 = vector<duckdb::Value,_true>::get<true>((vector<duckdb::Value,_true> *)(pFVar2 + 4),0);
    Value::ToString_abi_cxx11_(&path,pvVar3);
    pvVar3 = vector<duckdb::Value,_true>::get<true>((vector<duckdb::Value,_true> *)(pFVar2 + 4),1);
    Value::ToString_abi_cxx11_(&type,pvVar3);
    transaction_00.context.ptr = transaction.context.ptr;
    transaction_00.db.ptr = transaction.db.ptr;
    transaction_00.transaction.ptr = transaction.transaction.ptr;
    transaction_00.transaction_id = transaction.transaction_id;
    transaction_00.start_time = transaction.start_time;
    SecretManager::LookupSecret
              ((SecretManager *)&secret_match,transaction_00,(string *)path_00,&path);
    if (secret_match.secret_entry.
        super_unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
        super___uniq_ptr_impl<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>.
        super__Head_base<0UL,_duckdb::SecretEntry_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true,_true>)
        0x0) {
      pSVar4 = unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true>::
               operator*(&secret_match.secret_entry);
      output->count = 1;
      pBVar5 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
               ::operator->(&pSVar4->secret);
      ::std::__cxx11::string::string((string *)&local_b0,(string *)&pBVar5->name);
      Value::Value(&local_130,&local_b0);
      DataChunk::SetValue(output,0,0,&local_130);
      Value::~Value(&local_130);
      ::std::__cxx11::string::~string((string *)&local_b0);
      EnumUtil::ToString<duckdb::SecretPersistType>(&local_d0,pSVar4->persist_type);
      Value::Value(&local_130,&local_d0);
      DataChunk::SetValue(output,1,0,&local_130);
      Value::~Value(&local_130);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::__cxx11::string::string((string *)&local_f0,(string *)&pSVar4->storage_mode);
      Value::Value(&local_130,&local_f0);
      DataChunk::SetValue(output,2,0,&local_130);
      Value::~Value(&local_130);
      ::std::__cxx11::string::~string((string *)&local_f0);
    }
    *(undefined1 *)&pGVar1[1]._vptr_GlobalTableFunctionState = 1;
    ::std::unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>::~unique_ptr
              ((unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_> *)
               &secret_match);
    ::std::__cxx11::string::~string((string *)&type);
    ::std::__cxx11::string::~string((string *)&path);
  }
  return;
}

Assistant:

void DuckDBWhichSecretFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBWhichSecretData>();
	if (data.finished) {
		// finished returning values
		return;
	}
	auto &bind_data = data_p.bind_data->Cast<DuckDBWhichSecretBindData>();

	auto &secret_manager = SecretManager::Get(context);
	auto transaction = CatalogTransaction::GetSystemCatalogTransaction(context);

	auto &inputs = bind_data.inputs;
	auto path = inputs[0].ToString();
	auto type = inputs[1].ToString();
	auto secret_match = secret_manager.LookupSecret(transaction, path, type);
	if (secret_match.HasMatch()) {
		auto &secret_entry = *secret_match.secret_entry;
		output.SetCardinality(1);
		output.SetValue(0, 0, secret_entry.secret->GetName());
		output.SetValue(1, 0, EnumUtil::ToString(secret_entry.persist_type));
		output.SetValue(2, 0, secret_entry.storage_mode);
	}
	data.finished = true;
}